

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O0

void __thiscall
gimage::HighDynamicRangeFusion<unsigned_char>::add
          (HighDynamicRangeFusion<unsigned_char> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,float max_value,int id,
          uint64_t timestamp,bool replace_id)

{
  int iVar1;
  size_type sVar2;
  element_type *peVar3;
  reference pvVar4;
  long lVar5;
  long lVar6;
  invalid_argument *this_00;
  ImageFloat *pIVar7;
  int in_EDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long in_RDI;
  byte in_R8B;
  shared_ptr<gimage::HighDynamicRangeFusionBase::Data> p;
  size_t i;
  int k;
  shared_ptr<gimage::HighDynamicRangeFusionBase::Data> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  value_type *in_stack_ffffffffffffff38;
  store_t_conflict v;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  float fVar8;
  ImageFloat *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  ImageFloat *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined1 local_50 [8];
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffffb8;
  ImageFloat *in_stack_ffffffffffffffc0;
  int local_38;
  
  sVar2 = std::
          vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
          ::size((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                  *)(in_RDI + 0x18));
  if (sVar2 != 0) {
    std::
    vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
    ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                  *)(in_RDI + 0x18),0);
    peVar3 = std::
             __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14fbeb);
    pvVar4 = std::
             vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ::operator[](&peVar3->laplace,0);
    lVar5 = Image<float,_gimage::PixelTraits<float>_>::getWidth(pvVar4);
    lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI);
    if (lVar5 == lVar6) {
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                    *)(in_RDI + 0x18),0);
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14fc43);
      pvVar4 = std::
               vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               ::operator[](&peVar3->laplace,0);
      lVar5 = Image<float,_gimage::PixelTraits<float>_>::getHeight(pvVar4);
      lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI);
      if (lVar5 == lVar6) {
        std::
        vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
        ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                      *)(in_RDI + 0x18),0);
        peVar3 = std::
                 __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x14fc97);
        pvVar4 = std::
                 vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ::operator[](&peVar3->laplace,0);
        in_stack_ffffffffffffff94 = Image<float,_gimage::PixelTraits<float>_>::getDepth(pvVar4);
        iVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RSI);
        if (in_stack_ffffffffffffff94 == iVar1) goto LAB_0014fd28;
      }
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"HighDynamicRangeFusion::add(): All images must have same size and depth");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_0014fd28:
  local_38 = -1;
  if (-1 < in_EDX) {
    in_stack_ffffffffffffff78 = (ImageFloat *)0x0;
    while( true ) {
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffff78;
      pIVar7 = (ImageFloat *)
               std::
               vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
               ::size((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                       *)(in_RDI + 0x18));
      in_stack_ffffffffffffff87 = in_stack_ffffffffffffff78 < pIVar7 && local_38 < 0;
      if (in_stack_ffffffffffffff78 >= pIVar7 || local_38 >= 0) break;
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                    *)(in_RDI + 0x18),(size_type)in_stack_ffffffffffffffc0);
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14fdb8);
      if (peVar3->id == in_EDX) {
        local_38 = (int)in_stack_ffffffffffffffc0;
      }
      in_stack_ffffffffffffff78 = (ImageFloat *)((long)&in_stack_ffffffffffffffc0->depth + 1);
    }
  }
  if ((local_38 < 0) || ((in_R8B & 1) != 0)) {
    std::make_shared<gimage::HighDynamicRangeFusionBase::Data,int&,unsigned_long&>
              (in_stack_ffffffffffffff58,(unsigned_long *)in_stack_ffffffffffffff50);
    if (local_38 < 0) {
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::push_back((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                   *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      v = (store_t_conflict)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    }
    else {
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                    *)(in_RDI + 0x18),(long)local_38);
      v = (store_t_conflict)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>::operator=
                ((shared_ptr<gimage::HighDynamicRangeFusionBase::Data> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
    }
    std::
    __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x14feaa);
    createLaplacianPyramid<unsigned_char>
              ((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    fVar8 = (float)((ulong)local_50 >> 0x20);
    peVar3 = std::
             __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14fed2);
    pIVar7 = (ImageFloat *)&peVar3->weight;
    peVar3 = std::
             __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14fee5);
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::size(&peVar3->laplace);
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::resize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    peVar3 = std::
             __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14ff0d);
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::operator[](&peVar3->weight,0);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI);
    Image<float,_gimage::PixelTraits<float>_>::setSize
              ((Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (long)in_stack_ffffffffffffff88,
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               (long)in_stack_ffffffffffffff78);
    if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14ffe9);
      fVar8 = (float)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->weight,0);
      Image<float,_gimage::PixelTraits<float>_>::operator=(in_stack_ffffffffffffff40,v);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14ff85);
      sVar2 = 0;
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->weight,0);
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14ffa9);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->laplace,sVar2);
      HighDynamicRangeFusionBase::setContrastWeight
                ((HighDynamicRangeFusionBase *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,pIVar7,fVar8);
      fVar8 = (float)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    }
    if ((*(byte *)(in_RDI + 0x32) & 1) != 0) {
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x150028);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->weight,0);
      mulWellExposednessWeight
                ((HighDynamicRangeFusion<unsigned_char> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,
                 (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),fVar8);
    }
    if (((*(byte *)(in_RDI + 0x30) & 1) != 0) &&
       (iVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RSI),
       1 < iVar1)) {
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x150094);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->weight,0);
      mulSaturationWeight((HighDynamicRangeFusion<unsigned_char> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88,
                          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),fVar8);
    }
    std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>::~shared_ptr
              ((shared_ptr<gimage::HighDynamicRangeFusionBase::Data> *)0x1500d6);
  }
  return;
}

Assistant:

void add(const Image<T> &image, float max_value=255, int id=-1, uint64_t timestamp=0,
      bool replace_id=true)
    {
      // check that image has same size and depth as previous images

      if (list.size() > 0 && (list[0]->laplace[0].getWidth() != image.getWidth() ||
          list[0]->laplace[0].getHeight() != image.getHeight() ||
          list[0]->laplace[0].getDepth() != image.getDepth()))
      {
        throw std::invalid_argument("HighDynamicRangeFusion::add(): All images must have same size and depth");
      }

      // find existing data set with the same id

      int k=-1;
      if (id >= 0)
      {
        for (size_t i=0; i<list.size() && k < 0; i++)
        {
          if (list[i]->id == id)
          {
            k=static_cast<int>(i);
          }
        }
      }

      if (k >= 0 && !replace_id)
      {
        return;
      }

      // add, replace or skip data set, depending on the id and replace_id

      std::shared_ptr<Data> p=std::make_shared<Data>(id, timestamp);

      if (k >= 0)
      {
        list[k]=p;
      }
      else
      {
        list.push_back(p);
      }

      // create Laplace pyramid from image

      createLaplacianPyramid(p->laplace, image);

      // compute weights for highest resolution

      p->weight.resize(p->laplace.size());
      p->weight[0].setSize(image.getWidth(), image.getHeight(), 1);

      // weight according to local contrast

      if (contrast)
      {
        setContrastWeight(p->weight[0], p->laplace[0], max_value);
      }
      else
      {
        p->weight[0]=1;
      }

      // weight according to exposedness, i.e. not under- or overexposed

      if (well_exposedness)
      {
        mulWellExposednessWeight(p->weight[0], image, max_value);
      }

      // if color image, weight according to saturation

      if (saturation && image.getDepth() > 1)
      {
        mulSaturationWeight(p->weight[0], image, max_value);
      }
    }